

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O3

Node * __thiscall
Parser::createLocalFunctionNode
          (Parser *this,Token *t,Node *optional_name,Node *parameters_list,Node *function_body)

{
  pointer *pppNVar1;
  Node *this_00;
  iterator iVar2;
  vector<Node_*,_std::allocator<Node_*>_> *this_01;
  Node *local_48;
  Node *local_40;
  Node *local_38;
  
  local_48 = function_body;
  local_40 = parameters_list;
  local_38 = optional_name;
  this_00 = (Node *)operator_new(0x30);
  CompilationContext::Poolable::Poolable((Poolable *)this_00,this->ctx);
  this_00->tok = t;
  this_01 = &this_00->children;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->nodeType = PNT_LOCAL_FUNCTION;
  std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
            ((vector<Node*,std::allocator<Node*>> *)this_01,(iterator)0x0,&local_38);
  iVar2._M_current =
       (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
              ((vector<Node*,std::allocator<Node*>> *)this_01,iVar2,&local_40);
    iVar2._M_current =
         (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = parameters_list;
    iVar2._M_current =
         (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  if (iVar2._M_current ==
      (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
              ((vector<Node*,std::allocator<Node*>> *)this_01,iVar2,&local_48);
  }
  else {
    *iVar2._M_current = function_body;
    pppNVar1 = &(this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  return this_00;
}

Assistant:

Node * createLocalFunctionNode(Token & t, Node * optional_name, Node * parameters_list, Node * function_body)
  {
    Node * n = new Node(ctx, t);
    n->nodeType = PNT_LOCAL_FUNCTION;
    n->children.push_back(optional_name);
    n->children.push_back(parameters_list);
    n->children.push_back(function_body);
    return n;
  }